

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void __thiscall
cmCacheManager::WritePropertyEntries
          (cmCacheManager *this,ostream *os,CacheIterator i,cmMessenger *messenger)

{
  char *__s;
  char **ppcVar1;
  string key;
  string helpstring;
  allocator<char> local_b1;
  _Base_ptr local_b0;
  cmMessenger *local_a8;
  CacheIterator local_a0;
  string local_90;
  string local_70;
  string local_50;
  
  local_a0.Position = i.Position._M_node;
  local_a0.Container = i.Container;
  local_b0 = local_a0.Position._M_node + 1;
  local_a8 = messenger;
  for (ppcVar1 = PersistentProperties; *ppcVar1 != (char *)0x0; ppcVar1 = ppcVar1 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,*ppcVar1,(allocator<char> *)&local_70);
    __s = CacheIterator::GetProperty(&local_a0,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (__s != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,*ppcVar1,(allocator<char> *)&local_70);
      std::__cxx11::string::append((char *)&local_50);
      std::__cxx11::string::string((string *)&local_70,(string *)local_b0);
      std::__cxx11::string::append((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      OutputHelpString(os,&local_50);
      std::__cxx11::string::string((string *)&local_70,(string *)local_b0);
      std::__cxx11::string::append((char *)&local_70);
      std::__cxx11::string::append((char *)&local_70);
      OutputKey(os,&local_70);
      std::operator<<(os,":INTERNAL=");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_b1);
      OutputValue(os,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::operator<<(os,"\n");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_b1);
      OutputNewlineTruncationWarning(os,&local_70,&local_90,local_a8);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void cmCacheManager::WritePropertyEntries(std::ostream& os, CacheIterator i,
                                          cmMessenger* messenger)
{
  for (const char** p = cmCacheManager::PersistentProperties; *p; ++p) {
    if (const char* value = i.GetProperty(*p)) {
      std::string helpstring = *p;
      helpstring += " property for variable: ";
      helpstring += i.GetName();
      cmCacheManager::OutputHelpString(os, helpstring);

      std::string key = i.GetName();
      key += "-";
      key += *p;
      cmCacheManager::OutputKey(os, key);
      os << ":INTERNAL=";
      cmCacheManager::OutputValue(os, value);
      os << "\n";
      cmCacheManager::OutputNewlineTruncationWarning(os, key, value,
                                                     messenger);
    }
  }
}